

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_32U>::SmallDenseSet
          (SmallDenseSet<TypePair,_TypePairHasher,_32U> *this,Allocator *allocator)

{
  TypePair *local_20;
  Allocator *allocator_local;
  SmallDenseSet<TypePair,_TypePairHasher,_32U> *this_local;
  
  local_20 = this->storage;
  do {
    TypePair::TypePair(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (TypePair *)&this->allocator);
  this->allocator = allocator;
  this->bucketCount = 0x20;
  this->count = 0;
  this->data = this->storage;
  NULLC::fillMemory(this->data,0,(ulong)this->bucketCount << 4);
  return;
}

Assistant:

SmallDenseSet(Allocator *allocator = 0): allocator(allocator)
	{
		assert(N >= 2 && "size is too small");
		assert((N & (N - 1)) == 0 && "only power of 2 sizes are supported");

		bucketCount = N;

		count = 0;

		data = storage;

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);
	}